

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  int i;
  vector<int,_std::allocator<int>_> numbers;
  int local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter sequence of numbers separated by space.");
  std::operator<<(poVar2,"\nTo terminate the input enter \'.\' and press \'enter\':\n");
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  while( true ) {
    plVar3 = (long *)std::istream::operator>>((istream *)&std::cin,&local_3c);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_38,&local_3c);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"The mode is: ");
  iVar1 = findMode<int>((vector<int,_std::allocator<int>_> *)&local_38);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return 0;
}

Assistant:

int main()
{
	std::cout << "Enter sequence of numbers separated by space."
			  << "\nTo terminate the input enter '.' and press 'enter':\n";

	std::vector<int> numbers;
	for (auto i = 0; std::cin >> i;)
		numbers.push_back(i);
	std::cout << "The mode is: " << findMode(numbers) << std::endl;
	return 0;
}